

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::peer_connection::on_receive_data
          (peer_connection *this,error_code *error,size_t bytes_transferred)

{
  receive_buffer *this_00;
  bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void> *pbVar1;
  byte bVar2;
  short sVar3;
  long lVar4;
  session_settings *psVar5;
  element_type *peVar6;
  undefined1 auVar7 [16];
  char cVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  time_point tVar12;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__polymorphic_socket_hpp:71:5),_const_std::variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_&>
  _Var13;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_aux__polymorphic_socket_hpp:95:5),_std::variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_&>
  _Var14;
  undefined4 extraout_var_01;
  time_t tVar15;
  int iVar16;
  error_code *ec_00;
  error_code *ec_01;
  ulong uVar17;
  mutex *pmVar18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  int iVar19;
  uint uVar20;
  error_code ec;
  cork _c;
  shared_ptr<libtorrent::aux::peer_connection> me;
  error_code local_98;
  ulong local_88;
  string local_80;
  cork local_60;
  __shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  error_code local_40;
  
  iVar10 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
             _vptr_session_logger[5])();
  iVar19 = (int)bytes_transferred;
  if ((short)*(undefined4 *)(CONCAT44(extraout_var,iVar10) + 0x68) < 0) {
    print_error_abi_cxx11_(&local_80,(libtorrent *)error,ec_00);
    peer_log(this,incoming,"ON_RECEIVE_DATA","bytes: %d %s",bytes_transferred & 0xffffffff,
             local_80._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  counters::inc_stats_counter(this->m_counters,0x39,1);
  if (error->failed_ == true) {
    iVar10 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    if ((short)*(undefined4 *)(CONCAT44(extraout_var_00,iVar10) + 0x68) < 0) {
      print_error_abi_cxx11_(&local_80,(libtorrent *)error,ec_01);
      peer_log(this,info,"ERROR","in peer_connection::on_receive_data_impl %s",
               local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x30])(this,error,bytes_transferred);
    (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,error,0xb,0);
    return;
  }
  lVar4 = (this->m_connect).__d.__r;
  tVar12 = time_now();
  auVar7 = SEXT816((long)tVar12.__d.__r - lVar4) * SEXT816(0x431bde82d7b634db);
  (this->m_last_receive).m_time_diff.__r = (int)(auVar7._8_8_ >> 0x12) - (auVar7._12_4_ >> 0x1f);
  (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger)._vptr_session_logger
    [0x1f])();
  ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::peer_connection,void>
            (local_50,(__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
                      &this->super_enable_shared_from_this<libtorrent::aux::peer_connection>);
  bVar2 = (this->m_channel_state).
          super_array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>
          ._M_elems[0].m_val;
  local_60.m_need_uncork = (bVar2 & 4) == 0;
  if (local_60.m_need_uncork) {
    (this->m_channel_state).
    super_array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>
    ._M_elems[0].m_val = bVar2 | 4;
  }
  this_00 = &this->m_recv_buffer;
  local_60.m_pc = this;
  iVar11 = receive_buffer::max_receive(this_00);
  account_received_bytes(this,iVar19);
  iVar10 = this->m_extension_outstanding_bytes;
  if (0 < iVar10) {
    iVar16 = iVar19;
    if (iVar10 < iVar19) {
      iVar16 = iVar10;
    }
    this->m_extension_outstanding_bytes = iVar10 - iVar16;
  }
  check_graceful_pause(this);
  if (((this->super_peer_connection_hot_members).field_0x28 & 1) == 0) {
    if (iVar11 == iVar19) {
      local_80._M_dataplus._M_p = (pointer)&local_98;
      local_98._0_8_ = local_98._0_8_ & 0xffffff0000000000;
      local_98.cat_ =
           &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
      _Var13 = ::std::
               visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___tream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>const&>
                         ((anon_class_8_1_3fcf655c *)&local_80,
                          &(this->m_socket).
                           super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                         );
      if (local_98.failed_ == true) {
        bVar9 = false;
        (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,&local_98,0xe,0);
      }
      else {
        peer_log(this,incoming,"AVAILABLE","%d bytes",_Var13 & 0xffffffff);
        request_bandwidth(this,1,(int)_Var13);
        uVar17 = _Var13 & 0xffffffff;
        if (this->m_quota[1] < (int)_Var13) {
          uVar17 = (ulong)(uint)this->m_quota[1];
        }
        if ((int)uVar17 < 1) {
          bVar9 = true;
        }
        else {
          local_88 = uVar17;
          local_40 = (error_code)receive_buffer::reserve(this_00,(int)uVar17);
          local_80._M_dataplus._M_p = (pointer)&local_40;
          local_80._M_string_length = (size_type)&local_98;
          _Var14 = ::std::
                   visit<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::___ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>&>
                             ((anon_class_16_2_cd06c382 *)&local_80,
                              &(this->m_socket).
                               super_variant<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>
                             );
          if ((_Var14 == 0) && (bVar9 = local_98.failed_ == false, bVar9)) {
            pmVar18 = (mutex *)0x100000002;
            if ((DAT_004fcee8 != -0x70502de1da3a1f65) &&
               ((DAT_004fcee8 != -0x4d54ee85da8120f3 &&
                (cVar8 = (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                                   (&boost::asio::error::get_misc_category()::instance,2),
                cVar8 == '\0')))) {
              pmVar18 = (mutex *)0x2;
            }
            local_98.cat_ = (error_category *)&boost::asio::error::get_misc_category()::instance;
            local_98._0_8_ = pmVar18;
          }
          iVar10 = (*(((this->super_peer_connection_hot_members).m_ses)->super_session_logger).
                     _vptr_session_logger[5])();
          if ((short)*(undefined4 *)(CONCAT44(extraout_var_01,iVar10) + 0x68) < 0) {
            if (local_98.failed_ == true) {
              (*((error_category *)&(local_98.cat_)->_vptr_error_category)->_vptr_error_category[4])
                        (&local_80,local_98.cat_,local_98._0_8_ & 0xffffffff);
              peer_log(this,incoming,"SYNC_READ","max: %d ret: %d e: %s",local_88,
                       _Var14 & 0xffffffff,local_80._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1
                               );
              }
            }
            else {
              peer_log(this,incoming,"SYNC_READ","max: %d ret: %d e: %s",local_88,
                       _Var14 & 0xffffffff,"");
            }
          }
          bVar9 = true;
          if (local_98.failed_ == true) {
            if ((local_98.val_ != 0xb) ||
               (((local_98.cat_)->id_ != 0x8fafd21e25c5e09b &&
                ((local_98.cat_)->id_ != 0x8fafd21e25c5e09b)))) {
              bVar9 = false;
              (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(this,&local_98,0xb,0);
            }
          }
          else {
            account_received_bytes(this,(int)_Var14);
            bytes_transferred = bytes_transferred + _Var14;
          }
        }
      }
      if (!bVar9) goto LAB_00250d07;
    }
    sVar3 = *(short *)&this->field_0x885;
    do {
      iVar10 = receive_buffer::advance_pos(this_00,(int)bytes_transferred);
      (*(this->super_bandwidth_socket)._vptr_bandwidth_socket[0x30])(this,error,(long)iVar10);
      if (((this->super_peer_connection_hot_members).field_0x28 & 1) != 0) goto LAB_00250d07;
    } while ((0 < iVar10) &&
            (uVar20 = (int)bytes_transferred - iVar10, bytes_transferred = (size_t)uVar20,
            0 < (int)uVar20));
    iVar10 = 100;
    if (sVar3 < 0) {
      iVar10 = 0;
    }
    if (-1 < *(short *)&this->field_0x885) {
      iVar10 = 0;
    }
    receive_buffer::normalize(this_00,iVar10);
    iVar10 = receive_buffer::max_receive(this_00);
    if (iVar10 == 0) {
      psVar5 = (this->super_peer_connection_hot_members).m_settings;
      local_98._0_8_ = &psVar5->m_mutex;
      local_98.cat_ = (error_category *)((ulong)local_98.cat_ & 0xffffffffffffff00);
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_98);
      local_98.cat_ = (error_category *)CONCAT71(local_98.cat_._1_7_,1);
      iVar10 = (psVar5->m_store).m_ints._M_elems[0x3d];
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_98);
      receive_buffer::grow(this_00,iVar10);
      peer_log(this,incoming,"GROW_BUFFER","%d bytes",
               (ulong)(uint)(this->m_recv_buffer).m_recv_buffer.m_size);
    }
    bVar9 = is_seed(this);
    if (bVar9) {
      this_01 = (this->super_peer_connection_hot_members).m_torrent.
                super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar10 = this_01->_M_use_count;
        do {
          if (iVar10 == 0) {
            this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            break;
          }
          LOCK();
          iVar19 = this_01->_M_use_count;
          bVar9 = iVar10 == iVar19;
          if (bVar9) {
            this_01->_M_use_count = iVar10 + 1;
            iVar19 = iVar10;
          }
          iVar10 = iVar19;
          UNLOCK();
        } while (!bVar9);
      }
      if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar9 = true;
      }
      else {
        bVar9 = this_01->_M_use_count == 0;
      }
      peVar6 = (this->super_peer_connection_hot_members).m_torrent.
               super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (!(bool)(peVar6 == (element_type *)0x0 | bVar9)) {
        tVar15 = time((time_t *)0x0);
        peVar6->m_last_seen_complete = tVar15;
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
    }
    pbVar1 = (this->m_channel_state).
             super_array<libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::bandwidth_state_flags_tag,_void>,_2UL>
             ._M_elems + 1;
    pbVar1->m_val = pbVar1->m_val & 0xfb;
    setup_receive(this);
    if ((*(ushort *)&this->field_0x885 >> 0xd & 1) != 0) {
      *(ushort *)&this->field_0x885 = *(ushort *)&this->field_0x885 & 0xdfff;
      send_block_requests_impl(this);
    }
  }
LAB_00250d07:
  cork::~cork(&local_60);
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  return;
}

Assistant:

void peer_connection::on_receive_data(error_code const& error
		, std::size_t bytes_transferred)
	{
		TORRENT_ASSERT(is_single_thread());
		COMPLETE_ASYNC("peer_connection::on_receive_data");

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::incoming))
		{
			peer_log(peer_log_alert::incoming, "ON_RECEIVE_DATA"
				, "bytes: %d %s"
				, int(bytes_transferred), print_error(error).c_str());
		}
#endif

		// leave this bit set until we're done looping, reading from the socket.
		// that way we don't trigger any async read calls until the end of this
		// function.
		TORRENT_ASSERT(m_channel_state[download_channel] & peer_info::bw_network);

		TORRENT_ASSERT(bytes_transferred > 0 || error);

		m_counters.inc_stats_counter(counters::on_read_counter);

		INVARIANT_CHECK;

		if (error)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "ERROR"
					, "in peer_connection::on_receive_data_impl %s"
					, print_error(error).c_str());
			}
#endif
			on_receive(error, bytes_transferred);
			disconnect(error, operation_t::sock_read);
			return;
		}

		m_last_receive.set(m_connect, aux::time_now());

		// submit all disk jobs later
		m_ses.deferred_submit_jobs();

		// keep ourselves alive in until this function exits in
		// case we disconnect
		// this needs to be created before the invariant check,
		// to keep the object alive through the exit check
		std::shared_ptr<peer_connection> me(self());

		TORRENT_ASSERT(bytes_transferred > 0);

		// flush the send buffer at the end of this function
		cork _c(*this);

		// if we received exactly as many bytes as we provided a receive buffer
		// for. There most likely are more bytes to read, and we should grow our
		// receive buffer.
		TORRENT_ASSERT(int(bytes_transferred) <= m_recv_buffer.max_receive());
		bool const grow_buffer = (int(bytes_transferred) == m_recv_buffer.max_receive());
		account_received_bytes(int(bytes_transferred));

		if (m_extension_outstanding_bytes > 0)
			m_extension_outstanding_bytes -= std::min(m_extension_outstanding_bytes, int(bytes_transferred));

		check_graceful_pause();
		if (m_disconnecting) return;

		// this is the case where we try to grow the receive buffer and try to
		// drain the socket
		if (grow_buffer)
		{
			error_code ec;
			int buffer_size = int(m_socket.available(ec));
			if (ec)
			{
				disconnect(ec, operation_t::available);
				return;
			}

#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming, "AVAILABLE"
				, "%d bytes", buffer_size);
#endif

			request_bandwidth(download_channel, buffer_size);

			int const quota_left = m_quota[download_channel];
			if (buffer_size > quota_left) buffer_size = quota_left;
			if (buffer_size > 0)
			{
				span<char> const vec = m_recv_buffer.reserve(buffer_size);
				std::size_t const bytes = m_socket.read_some(
					boost::asio::mutable_buffer(vec.data(), std::size_t(vec.size())), ec);

				// this is weird. You would imagine read_some() would do this
				if (bytes == 0 && !ec) ec = boost::asio::error::eof;

#ifndef TORRENT_DISABLE_LOGGING
				if (should_log(peer_log_alert::incoming))
				{
					peer_log(peer_log_alert::incoming, "SYNC_READ", "max: %d ret: %d e: %s"
						, buffer_size, int(bytes), ec ? ec.message().c_str() : "");
				}
#endif

				TORRENT_ASSERT(bytes > 0 || ec);
				if (ec)
				{
					if (ec != boost::asio::error::would_block
						&& ec != boost::asio::error::try_again)
					{
						disconnect(ec, operation_t::sock_read);
						return;
					}
				}
				else
				{
					account_received_bytes(int(bytes));
					bytes_transferred += bytes;
				}
			}
		}

		// feed bytes in receive buffer to upper layer by calling on_receive()

		bool const prev_choked = m_peer_choked;
		int bytes = int(bytes_transferred);
		int sub_transferred = 0;
		do {
			sub_transferred = m_recv_buffer.advance_pos(bytes);
			TORRENT_ASSERT(sub_transferred > 0);
			on_receive(error, std::size_t(sub_transferred));
			bytes -= sub_transferred;
			if (m_disconnecting) return;
		} while (bytes > 0 && sub_transferred > 0);

		// if the peer went from unchoked to choked, suggest to the receive
		// buffer that it shrinks to 100 bytes
		int const force_shrink = (m_peer_choked && !prev_choked)
			? 100 : 0;
		m_recv_buffer.normalize(force_shrink);

		if (m_recv_buffer.max_receive() == 0)
		{
			// the message we're receiving is larger than our receive
			// buffer, we must grow.
			int const buffer_size_limit
				= m_settings.get_int(settings_pack::max_peer_recv_buffer_size);
			m_recv_buffer.grow(buffer_size_limit);
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::incoming, "GROW_BUFFER", "%d bytes"
				, m_recv_buffer.capacity());
#endif
		}

		TORRENT_ASSERT(m_recv_buffer.pos_at_end());
		TORRENT_ASSERT(m_recv_buffer.packet_size() > 0);

		if (is_seed())
		{
			auto t = m_torrent.lock();
			if (t) t->seen_complete();
		}

		// allow reading from the socket again
		TORRENT_ASSERT(m_channel_state[download_channel] & peer_info::bw_network);
		m_channel_state[download_channel] &= ~peer_info::bw_network;

		setup_receive();

		if (m_deferred_send_block_requests)
		{
			m_deferred_send_block_requests = false;
			send_block_requests_impl();
		}
	}